

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat2.c
# Opt level: O2

void Cbs2_ManWatchClause(Cbs2_Man_t *p,int hClause,int Lit)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  
  piVar1 = (p->pClauses).pData;
  iVar2 = Abc_LitNot(Lit);
  piVar4 = Vec_IntEntryP(&p->vWatches,iVar2);
  if (*piVar4 == 0) {
    iVar2 = Abc_LitNot(Lit);
    Vec_IntPush(&p->vWatchUpds,iVar2);
  }
  iVar2 = piVar1[(long)hClause + 2];
  iVar3 = iVar2;
  if ((piVar1[(long)hClause + 1] != Lit) && (iVar3 = Lit, iVar2 != Lit)) {
    __assert_fail("Lit == pLits[0] || Lit == pLits[1]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat2.c"
                  ,0x2a3,"void Cbs2_ManWatchClause(Cbs2_Man_t *, int, int)");
  }
  piVar1 = (p->pClauses).pData;
  piVar1[(int)((uint)(iVar3 == Lit) + hClause + piVar1[hClause] + 1)] = *piVar4;
  *piVar4 = hClause;
  return;
}

Assistant:

static inline void Cbs2_ManWatchClause( Cbs2_Man_t * p, int hClause, int Lit )
{
    int * pLits = Cbs2_ClauseLits( p, hClause );
    int * pPlace = Vec_IntEntryP( &p->vWatches, Abc_LitNot(Lit) );
    if ( *pPlace == 0 )
        Vec_IntPush( &p->vWatchUpds, Abc_LitNot(Lit) );
/*
    if ( pClause->pLits[0] == Lit )
        pClause->pNext0 = p->pWatches[lit_neg(Lit)];  
    else
    {
        assert( pClause->pLits[1] == Lit );
        pClause->pNext1 = p->pWatches[lit_neg(Lit)];  
    }
    p->pWatches[lit_neg(Lit)] = pClause;
*/
    assert( Lit == pLits[0] || Lit == pLits[1] );
    Cbs2_ClauseSetNext( p, hClause, Lit == pLits[1], *pPlace );
    *pPlace = hClause;
}